

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O3

vector<duckdb::RemapColumnInfo,_true> *
duckdb::RemapEntry::ConstructMap
          (vector<duckdb::RemapColumnInfo,_true> *__return_storage_ptr__,LogicalType *type,
          case_insensitive_map_t<RemapEntry> *remap_map)

{
  pointer pcVar1;
  child_list_t<LogicalType> *this;
  const_reference __k;
  const_reference pvVar2;
  const_iterator cVar3;
  type remap_map_00;
  BinderException *this_00;
  size_type __n;
  undefined1 local_b8 [16];
  vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_> local_a8;
  vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_> local_88;
  vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this = StructType::GetChildTypes_abi_cxx11_(type);
  (__return_storage_ptr__->
  super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
  super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
  super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>).
  super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      __k = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            ::operator[](this,__n);
      pvVar2 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
               ::operator[](this,__n);
      cVar3 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&remap_map->_M_h,&__k->first);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_true>
          ._M_cur == (__node_type *)0x0) {
        this_00 = (BinderException *)__cxa_allocate_exception(0x10);
        local_b8._0_8_ = &local_a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"Missing target value %s for remap","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar1 = (__k->first)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar1,pcVar1 + (__k->first)._M_string_length);
        BinderException::BinderException<std::__cxx11::string>(this_00,(string *)local_b8,&local_50)
        ;
        __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_a8.super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_b8._0_8_ =
           *(idx_t *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_true>
                            ._M_cur + 0x28);
      local_b8._8_8_ =
           *(idx_t *)((long)cVar3.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_true>
                            ._M_cur + 0x30);
      if ((pvVar2->second).id_ == STRUCT) {
        remap_map_00 = unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>,_true>
                       ::operator*((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>,_true>
                                    *)((long)cVar3.
                                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_true>
                                             ._M_cur + 0x50));
        ConstructMap((vector<duckdb::RemapColumnInfo,_true> *)&local_88,&pvVar2->second,remap_map_00
                    );
        local_68.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_a8.
             super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_68.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_a8.
             super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_68.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_a8.
             super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_a8.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_88.
             super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_a8.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_88.
             super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
        local_a8.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_88.
             super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_88.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.
        super__Vector_base<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::~vector
                  (&local_68);
        ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::~vector
                  (&local_88);
      }
      ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::
      emplace_back<duckdb::RemapColumnInfo>
                (&__return_storage_ptr__->
                  super_vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>,
                 (RemapColumnInfo *)local_b8);
      ::std::vector<duckdb::RemapColumnInfo,_std::allocator<duckdb::RemapColumnInfo>_>::~vector
                (&local_a8);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->
                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ).
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->
                                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ).
                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x6db6db6db6db6db7));
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<RemapColumnInfo> ConstructMap(const LogicalType &type,
	                                            const case_insensitive_map_t<RemapEntry> &remap_map) {
		auto &target_children = StructType::GetChildTypes(type);
		vector<RemapColumnInfo> result;
		for (idx_t target_idx = 0; target_idx < target_children.size(); target_idx++) {
			auto &target_name = target_children[target_idx].first;
			auto &child_type = target_children[target_idx].second;
			auto entry = remap_map.find(target_name);
			if (entry == remap_map.end()) {
				throw BinderException("Missing target value %s for remap", target_name);
			}
			RemapColumnInfo info;
			info.index = entry->second.index;
			info.default_index = entry->second.default_index;
			if (child_type.id() == LogicalTypeId::STRUCT) {
				// recurse
				info.child_remap_info = ConstructMap(child_type, *entry->second.child_remaps);
			}
			result.push_back(std::move(info));
		}
		return result;
	}